

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addConstructor(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  uint uVar1;
  char *data;
  QMetaMethodBuilderPrivate *pQVar2;
  QArrayDataPointer<QByteArray> *other;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __type;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar3;
  QArrayDataPointer<QByteArray> local_50;
  QMetaMethodBuilder local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._mobj = (QMetaObjectBuilder *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._index = -0x55555556;
  local_38._12_4_ = 0xaaaaaaaa;
  QMetaMethod::methodSignature((QByteArray *)&local_50,prototype);
  QVar3 = addConstructor(this,(QByteArray *)&local_50);
  local_38._mobj = QVar3._mobj;
  local_38._index = QVar3._index;
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
    }
  }
  data = QMetaMethod::typeName(prototype);
  QByteArray::QByteArray((QByteArray *)&local_50,data,-1);
  QMetaMethodBuilder::setReturnType(&local_38,(QByteArray *)&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
    }
  }
  QMetaMethod::parameterNames((QList<QByteArray> *)&local_50,prototype);
  pQVar2 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar2 != (QMetaMethodBuilderPrivate *)0x0) {
    QArrayDataPointer<QByteArray>::operator=(&(pQVar2->parameterNames).d,&local_50);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_50);
  other = (QArrayDataPointer<QByteArray> *)QMetaMethod::tag(prototype);
  QByteArray::QByteArray((QByteArray *)&local_50,(char *)other,-1);
  pQVar2 = QMetaMethodBuilder::d_func(&local_38);
  __type = extraout_EDX;
  if (pQVar2 != (QMetaMethodBuilderPrivate *)0x0) {
    other = &local_50;
    QByteArray::operator=(&pQVar2->tag,(QByteArray *)other);
    __type = extraout_EDX_00;
  }
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      other = (QArrayDataPointer<QByteArray> *)0x1;
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,1,0x10);
      __type = extraout_EDX_01;
    }
  }
  uVar1 = QMetaMethod::access(prototype,(char *)other,__type);
  pQVar2 = QMetaMethodBuilder::d_func(&local_38);
  if ((pQVar2 != (QMetaMethodBuilderPrivate *)0x0) && ((pQVar2->attributes & 0xcU) != 4)) {
    pQVar2->attributes = pQVar2->attributes & 0xfffffffcU | uVar1;
  }
  uVar1 = QMetaMethod::attributes(prototype);
  pQVar2 = QMetaMethodBuilder::d_func(&local_38);
  if (pQVar2 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar2->attributes = (uVar1 & 7) << 4 | pQVar2->attributes & 0xffffff8fU;
  }
  QVar3._index = local_38._index;
  QVar3._mobj = local_38._mobj;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar3._12_4_ = 0;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addConstructor(const QMetaMethod &prototype)
{
    Q_ASSERT(prototype.methodType() == QMetaMethod::Constructor);
    QMetaMethodBuilder ctor = addConstructor(prototype.methodSignature());
    ctor.setReturnType(prototype.typeName());
    ctor.setParameterNames(prototype.parameterNames());
    ctor.setTag(prototype.tag());
    ctor.setAccess(prototype.access());
    ctor.setAttributes(prototype.attributes());
    return ctor;
}